

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

bool __thiscall
QFileSystemModel::setData(QFileSystemModel *this,QModelIndex *idx,QVariant *value,int role)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Int IVar4;
  QFileSystemNode *pQVar5;
  pointer pQVar6;
  QFileInfoGatherer *this_00;
  pointer fileInfo;
  QFileSystemNode **ppQVar7;
  int in_ECX;
  QModelIndex *in_RSI;
  QFileSystemModel *in_RDI;
  long in_FS_OFFSET;
  int visibleLocation;
  QFileSystemNode *parentNode;
  QFileSystemNode *indexNode;
  QFileSystemModelPrivate *d;
  unique_ptr<QFileSystemModelPrivate::QFileSystemNode,_std::default_delete<QFileSystemModelPrivate::QFileSystemNode>_>
  nodeToRename;
  QString parentPath;
  QString oldName;
  QString newName;
  undefined4 in_stack_fffffffffffffe68;
  CaseSensitivity in_stack_fffffffffffffe6c;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  QFileSystemModelPrivate *in_stack_fffffffffffffe78;
  QFileSystemNode *fileInfo_00;
  undefined8 in_stack_fffffffffffffe80;
  int arole;
  QModelIndex *in_stack_fffffffffffffe88;
  undefined5 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea5;
  undefined1 in_stack_fffffffffffffea6;
  undefined1 in_stack_fffffffffffffea7;
  byte bVar8;
  bool local_f1;
  QDir local_f0 [8];
  QFileInfo local_e8 [48];
  undefined1 *local_b8;
  QDir local_b0 [8];
  undefined1 local_a8 [24];
  undefined1 local_90 [24];
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined4 local_30;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_2c;
  QVariant local_28;
  long local_8;
  
  arole = (int)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QFileSystemModel *)0xaa5afd);
  bVar1 = QModelIndex::isValid
                    ((QModelIndex *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
  bVar2 = true;
  if (bVar1) {
    iVar3 = QModelIndex::column(in_RSI);
    bVar2 = true;
    if ((iVar3 == 0) && (bVar2 = true, in_ECX == 2)) {
      local_30 = (**(code **)(*(long *)in_RDI + 0x138))(in_RDI,in_RSI);
      local_2c.super_QFlagsStorage<Qt::ItemFlag>.i =
           (QFlagsStorage<Qt::ItemFlag>)
           QFlags<Qt::ItemFlag>::operator&
                     ((QFlags<Qt::ItemFlag> *)
                      CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                      in_stack_fffffffffffffe6c);
      IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_2c);
      bVar2 = IVar4 == 0;
    }
  }
  if (bVar2) {
    local_f1 = false;
  }
  else {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::toString();
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::data(in_stack_fffffffffffffe88,arole);
    ::QVariant::toString();
    ::QVariant::~QVariant(&local_28);
    bVar2 = ::operator==((QString *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                         (QString *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    if (bVar2) {
      local_f1 = true;
    }
    else {
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      local_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      (**(code **)(*(long *)in_RDI + 0x68))(local_90,in_RDI,in_RSI);
      filePath(in_RDI,(QModelIndex *)
                      CONCAT17(in_stack_fffffffffffffea7,
                               CONCAT16(in_stack_fffffffffffffea6,
                                        CONCAT15(in_stack_fffffffffffffea5,in_stack_fffffffffffffea0
                                                ))));
      bVar2 = QString::isEmpty((QString *)0xaa5cf3);
      bVar8 = 1;
      if (!bVar2) {
        QDir::toNativeSeparators((QString *)local_a8);
        QDir::separator();
        bVar8 = QString::contains((QString *)
                                  CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                                  (QChar)(char16_t)((ulong)in_stack_fffffffffffffe78 >> 0x30),
                                  in_stack_fffffffffffffe6c);
        QString::~QString((QString *)0xaa5d62);
      }
      if ((bVar8 & 1) == 0) {
        QDir::QDir(local_b0,(QString *)&local_78);
        bVar8 = QDir::rename((QString *)local_b0,(QString *)&local_60);
        bVar8 = bVar8 ^ 0xff;
        QDir::~QDir(local_b0);
        if ((bVar8 & 1) == 0) {
          pQVar5 = QFileSystemModelPrivate::node
                             (in_stack_fffffffffffffe78,
                              (QModelIndex *)
                              CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
          pQVar5 = pQVar5->parent;
          fileInfo_00 = pQVar5;
          QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::value
                    ((QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*> *)pQVar5,
                     (QString *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
          QFileSystemModelPrivate::QFileSystemNode::visibleLocation
                    ((QFileSystemNode *)
                     CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                     (QString *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          QList<QString>::removeAt
                    ((QList<QString> *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70)
                     ,CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          local_b8 = &DAT_aaaaaaaaaaaaaaaa;
          QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::take
                    ((QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*> *)
                     CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                     (QString *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          std::
          unique_ptr<QFileSystemModelPrivate::QFileSystemNode,std::default_delete<QFileSystemModelPrivate::QFileSystemNode>>
          ::unique_ptr<std::default_delete<QFileSystemModelPrivate::QFileSystemNode>,void>
                    ((unique_ptr<QFileSystemModelPrivate::QFileSystemNode,_std::default_delete<QFileSystemModelPrivate::QFileSystemNode>_>
                      *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                     (pointer)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          pQVar6 = std::
                   unique_ptr<QFileSystemModelPrivate::QFileSystemNode,_std::default_delete<QFileSystemModelPrivate::QFileSystemNode>_>
                   ::operator->((unique_ptr<QFileSystemModelPrivate::QFileSystemNode,_std::default_delete<QFileSystemModelPrivate::QFileSystemNode>_>
                                 *)0xaa5e8d);
          QString::operator=(&pQVar6->fileName,(QString *)&local_48);
          pQVar6 = std::
                   unique_ptr<QFileSystemModelPrivate::QFileSystemNode,_std::default_delete<QFileSystemModelPrivate::QFileSystemNode>_>
                   ::operator->((unique_ptr<QFileSystemModelPrivate::QFileSystemNode,_std::default_delete<QFileSystemModelPrivate::QFileSystemNode>_>
                                 *)0xaa5eb4);
          pQVar6->parent = pQVar5;
          this_00 = (QFileInfoGatherer *)
                    std::
                    unique_ptr<QFileSystemModelPrivate::QFileSystemNode,_std::default_delete<QFileSystemModelPrivate::QFileSystemNode>_>
                    ::operator->((unique_ptr<QFileSystemModelPrivate::QFileSystemNode,_std::default_delete<QFileSystemModelPrivate::QFileSystemNode>_>
                                  *)0xaa5eca);
          fileInfo = std::unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>::
                     operator->((unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>
                                 *)0xaa5ee0);
          QDir::QDir(local_f0,(QString *)&local_78);
          QFileInfo::QFileInfo(local_e8,local_f0,(QString *)&local_48);
          QFileInfoGatherer::getInfo(this_00,(QFileInfo *)fileInfo);
          QFileSystemModelPrivate::QFileSystemNode::populate
                    (pQVar5,(QExtendedInformation *)fileInfo_00);
          QExtendedInformation::~QExtendedInformation
                    ((QExtendedInformation *)
                     CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
          QFileInfo::~QFileInfo(local_e8);
          QDir::~QDir(local_f0);
          pQVar6 = std::
                   unique_ptr<QFileSystemModelPrivate::QFileSystemNode,_std::default_delete<QFileSystemModelPrivate::QFileSystemNode>_>
                   ::operator->((unique_ptr<QFileSystemModelPrivate::QFileSystemNode,_std::default_delete<QFileSystemModelPrivate::QFileSystemNode>_>
                                 *)0xaa5f77);
          pQVar6->isVisible = true;
          pQVar6 = std::
                   unique_ptr<QFileSystemModelPrivate::QFileSystemNode,_std::default_delete<QFileSystemModelPrivate::QFileSystemNode>_>
                   ::release((unique_ptr<QFileSystemModelPrivate::QFileSystemNode,_std::default_delete<QFileSystemModelPrivate::QFileSystemNode>_>
                              *)0xaa5f88);
          ppQVar7 = QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::operator[]
                              ((QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*> *)pQVar5,
                               &fileInfo_00->fileName);
          *ppQVar7 = pQVar6;
          QList<QString>::insert
                    ((QList<QString> *)fileInfo_00,
                     CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                     (parameter_type)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          QFileSystemModelPrivate::delayedSort
                    ((QFileSystemModelPrivate *)
                     CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
          fileRenamed((QFileSystemModel *)pQVar5,&fileInfo_00->fileName,
                      (QString *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                      (QString *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          std::
          unique_ptr<QFileSystemModelPrivate::QFileSystemNode,_std::default_delete<QFileSystemModelPrivate::QFileSystemNode>_>
          ::~unique_ptr((unique_ptr<QFileSystemModelPrivate::QFileSystemNode,_std::default_delete<QFileSystemModelPrivate::QFileSystemNode>_>
                         *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
          local_f1 = true;
        }
        else {
          local_f1 = false;
        }
      }
      else {
        local_f1 = false;
      }
      QString::~QString((QString *)0xaa6021);
    }
    QString::~QString((QString *)0xaa602e);
    QString::~QString((QString *)0xaa603b);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_f1;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemModel::setData(const QModelIndex &idx, const QVariant &value, int role)
{
    Q_D(QFileSystemModel);
    if (!idx.isValid()
        || idx.column() != 0
        || role != Qt::EditRole
        || (flags(idx) & Qt::ItemIsEditable) == 0) {
        return false;
    }

    QString newName = value.toString();
#ifdef Q_OS_WIN
    chopSpaceAndDot(newName);
    if (newName.isEmpty())
        return false;
#endif

    QString oldName = idx.data().toString();
    if (newName == oldName)
        return true;

    const QString parentPath = filePath(parent(idx));

    if (newName.isEmpty() || QDir::toNativeSeparators(newName).contains(QDir::separator()))
        return false;

#if QT_CONFIG(filesystemwatcher) && defined(Q_OS_WIN)
    // QTBUG-65683: Remove file system watchers prior to renaming to prevent
    // failure due to locked files on Windows.
    const QStringList watchedPaths = d->unwatchPathsAt(idx);
#endif // filesystemwatcher && Q_OS_WIN
    if (!QDir(parentPath).rename(oldName, newName)) {
#if QT_CONFIG(filesystemwatcher) && defined(Q_OS_WIN)
        d->watchPaths(watchedPaths);
#endif
        return false;
    } else {
        /*
            *After re-naming something we don't want the selection to change*
            - can't remove rows and later insert
            - can't quickly remove and insert
            - index pointer can't change because treeview doesn't use persistent index's

            - if this get any more complicated think of changing it to just
              use layoutChanged
         */

        QFileSystemModelPrivate::QFileSystemNode *indexNode = d->node(idx);
        QFileSystemModelPrivate::QFileSystemNode *parentNode = indexNode->parent;
        int visibleLocation = parentNode->visibleLocation(parentNode->children.value(indexNode->fileName)->fileName);

        parentNode->visibleChildren.removeAt(visibleLocation);
        std::unique_ptr<QFileSystemModelPrivate::QFileSystemNode> nodeToRename(parentNode->children.take(oldName));
        nodeToRename->fileName = newName;
        nodeToRename->parent = parentNode;
#if QT_CONFIG(filesystemwatcher)
        nodeToRename->populate(d->fileInfoGatherer->getInfo(QFileInfo(parentPath, newName)));
#endif
        nodeToRename->isVisible = true;
        parentNode->children[newName] = nodeToRename.release();
        parentNode->visibleChildren.insert(visibleLocation, newName);

        d->delayedSort();
        emit fileRenamed(parentPath, oldName, newName);
    }
    return true;
}